

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O2

int raviX_ptrlist_size(PtrList *self)

{
  PtrList **ppPVar1;
  int iVar2;
  PtrList *list;
  PtrList *pPVar3;
  
  iVar2 = 0;
  pPVar3 = self;
  if (self != (PtrList *)0x0) {
    do {
      ppPVar1 = &pPVar3->next_;
      iVar2 = iVar2 + (short)((short)(char)*(undefined2 *)pPVar3 -
                             (short)(char)((ushort)*(undefined2 *)pPVar3 >> 8));
      pPVar3 = *ppPVar1;
    } while (*ppPVar1 != self);
  }
  return iVar2;
}

Assistant:

int raviX_ptrlist_size(const PtrList *self)
{
	int nr = 0;
	if (self) {
		const PtrList *list = self;
		do {
			nr += list->nr_ - list->rm_;
		} while ((list = list->next_) != self);
	}
	return nr;
}